

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase
          (DescriptorPool *this,string_view name,DeferredValidation *deferred_validation)

{
  DescriptorDatabase *pDVar1;
  string_view name_00;
  bool bVar2;
  int iVar3;
  FileDescriptorProto *proto;
  undefined8 *puVar4;
  FileDescriptor *pFVar5;
  string_view key;
  allocator<char> local_59;
  key_arg<std::basic_string_view<char>_> local_58;
  string local_48 [32];
  
  local_58._M_str = name._M_str;
  local_58._M_len = name._M_len;
  if ((this->fallback_database_ != (DescriptorDatabase *)0x0) &&
     (bVar2 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              ::contains<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                          *)&((this->tables_)._M_t.
                              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              .
                              super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                             ._M_head_impl)->known_bad_symbols_,&local_58), !bVar2)) {
    proto = DeferredValidation::CreateProto(deferred_validation);
    name_00._M_str = local_58._M_str;
    name_00._M_len = local_58._M_len;
    bVar2 = IsSubSymbolOfBuiltType(this,name_00);
    if (!bVar2) {
      pDVar1 = this->fallback_database_;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_48,&local_58,&local_59);
      iVar3 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_48,proto);
      if (((char)iVar3 == '\0') ||
         (puVar4 = (undefined8 *)
                   ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
         key._M_str = (char *)*puVar4, key._M_len = puVar4[1],
         pFVar5 = Tables::FindFile((this->tables_)._M_t.
                                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                   ._M_head_impl,key), pFVar5 != (FileDescriptor *)0x0)) {
        bVar2 = false;
      }
      else {
        pFVar5 = BuildFileFromDatabase(this,proto,deferred_validation);
        bVar2 = pFVar5 != (FileDescriptor *)0x0;
      }
      std::__cxx11::string::~string(local_48);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    absl::string_view name, DeferredValidation& deferred_validation) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_symbols_.contains(name)) return false;

  auto& file_proto = deferred_validation.CreateProto();
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(std::string(name),
                                                       &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto, deferred_validation) == nullptr) {
    return false;
  }

  return true;
}